

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_color_blend_advanced_state
          (Impl *this,Value *state,VkPipelineColorBlendAdvancedStateCreateInfoEXT **out_info)

{
  VkPipelineColorBlendAdvancedStateCreateInfoEXT *pVVar1;
  Type pGVar2;
  
  pVVar1 = (VkPipelineColorBlendAdvancedStateCreateInfoEXT *)
           ScratchAllocator::allocate_raw(&this->allocator,0x20,0x10);
  if (pVVar1 != (VkPipelineColorBlendAdvancedStateCreateInfoEXT *)0x0) {
    pVVar1->srcPremultiplied = 0;
    pVVar1->dstPremultiplied = 0;
    *(undefined8 *)&pVVar1->blendOverlap = 0;
    *(undefined8 *)pVVar1 = 0;
    pVVar1->pNext = (void *)0x0;
  }
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"blendOverlap");
  if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar1->blendOverlap = (pGVar2->data_).s.length;
    pGVar2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"srcPremultiplied");
    if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      pVVar1->srcPremultiplied = (pGVar2->data_).s.length;
      pGVar2 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)state,"dstPremultiplied");
      if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000)
          != (undefined1  [16])0x0) {
        pVVar1->dstPremultiplied = (pGVar2->data_).s.length;
        *out_info = pVVar1;
        return true;
      }
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_color_blend_advanced_state(const Value &state,
                                                           VkPipelineColorBlendAdvancedStateCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineColorBlendAdvancedStateCreateInfoEXT>();

	info->blendOverlap = static_cast<VkBlendOverlapEXT>(state["blendOverlap"].GetUint());
	info->srcPremultiplied = state["srcPremultiplied"].GetUint();
	info->dstPremultiplied = state["dstPremultiplied"].GetUint();

	*out_info = info;
	return true;
}